

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int util::text_max_word_width(string *string)

{
  ulong uVar1;
  char *pcVar2;
  int *piVar3;
  byte *pbVar4;
  ulong local_20;
  size_t i;
  int length;
  int max_length;
  string *string_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  local_20 = 0;
  _length = string;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= local_20) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_length);
    if (*pcVar2 == ' ') {
      piVar3 = std::max<int>((int *)((long)&i + 4),(int *)&i);
      i._4_4_ = *piVar3;
      i._0_4_ = 0;
    }
    else {
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)_length);
      i._0_4_ = *(int *)(sizes + (long)(int)(uint)*pbVar4 * 4) + (int)i;
    }
    local_20 = local_20 + 1;
  }
  piVar3 = std::max<int>((int *)((long)&i + 4),(int *)&i);
  return *piVar3;
}

Assistant:

int text_max_word_width(const std::string& string)
{
	int max_length = 0;
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		if (string[i] == ' ')
		{
			max_length = std::max(max_length, length);
			length = 0;
		}
		else
		{
			length += sizes[string[i] & 0xFF];
		}
	}

	return std::max(max_length, length);
}